

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O2

void read_rle_pixel(tga_source_ptr sinfo)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  if (sinfo->dup_pixel_count < 1) {
    iVar2 = sinfo->block_count;
    sinfo->block_count = iVar2 + -1;
    if (iVar2 < 1) {
      uVar1 = read_byte(sinfo);
      uVar3 = uVar1 & 0x7f;
      if ((char)uVar1 < '\0') {
        sinfo->dup_pixel_count = uVar3;
        uVar3 = 0;
      }
      sinfo->block_count = uVar3;
    }
    for (lVar4 = 0; lVar4 < sinfo->pixel_size; lVar4 = lVar4 + 1) {
      iVar2 = read_byte(sinfo);
      sinfo->tga_pixel[lVar4] = (U_CHAR)iVar2;
    }
  }
  else {
    sinfo->dup_pixel_count = sinfo->dup_pixel_count + -1;
  }
  return;
}

Assistant:

METHODDEF(void)
read_rle_pixel(tga_source_ptr sinfo)
/* Read one Targa pixel from the input file, expanding RLE data as needed */
{
  register int i;

  /* Duplicate previously read pixel? */
  if (sinfo->dup_pixel_count > 0) {
    sinfo->dup_pixel_count--;
    return;
  }

  /* Time to read RLE block header? */
  if (--sinfo->block_count < 0) { /* decrement pixels remaining in block */
    i = read_byte(sinfo);
    if (i & 0x80) {             /* Start of duplicate-pixel block? */
      sinfo->dup_pixel_count = i & 0x7F; /* number of dups after this one */
      sinfo->block_count = 0;   /* then read new block header */
    } else {
      sinfo->block_count = i & 0x7F; /* number of pixels after this one */
    }
  }

  /* Read next pixel */
  for (i = 0; i < sinfo->pixel_size; i++) {
    sinfo->tga_pixel[i] = (U_CHAR)read_byte(sinfo);
  }
}